

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::pointer_writer<unsigned_long>&>
          (basic_writer<fmt::v6::buffer_range<wchar_t>> *this,format_specs *specs,
          pointer_writer<unsigned_long> *f)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  char_type fill;
  wchar_t local_34;
  checked_ptr<typename_buffer<wchar_t>::value_type> local_30;
  
  uVar1 = specs->width;
  uVar3 = f->num_digits + 2;
  if (uVar3 < uVar1) {
    local_30 = reserve<fmt::v6::internal::buffer<wchar_t>,_0>
                         ((back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_> *)this,
                          (ulong)uVar1);
    local_34 = (specs->fill).data_[0];
    uVar4 = (ulong)uVar1 - (ulong)uVar3;
    bVar2 = specs->field_0x9 & 0xf;
    if (bVar2 == 3) {
      local_30 = std::__fill_n_a<wchar_t*,unsigned_long,wchar_t>(local_30,uVar4 >> 1,&local_34);
      pointer_writer<unsigned_long>::operator()((pointer_writer<unsigned_long> *)f,&local_30);
      uVar4 = uVar4 - (uVar4 >> 1);
    }
    else {
      if (bVar2 == 2) {
        local_30 = std::__fill_n_a<wchar_t*,unsigned_long,wchar_t>(local_30,uVar4,&local_34);
        pointer_writer<unsigned_long>::operator()((pointer_writer<unsigned_long> *)f,&local_30);
        return;
      }
      pointer_writer<unsigned_long>::operator()((pointer_writer<unsigned_long> *)f,&local_30);
    }
    std::__fill_n_a<wchar_t*,unsigned_long,wchar_t>(local_30,uVar4,&local_34);
  }
  else {
    local_30 = reserve<fmt::v6::internal::buffer<wchar_t>,_0>
                         ((back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_> *)this,
                          (ulong)uVar3);
    pointer_writer<unsigned_long>::operator()((pointer_writer<unsigned_long> *)f,&local_30);
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }